

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BiasLayerParams::InternalSwap(BiasLayerParams *this,BiasLayerParams *other)

{
  intptr_t iVar1;
  WeightParams *pWVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other_00);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar6 = (this->shape_).current_size_;
  iVar7 = (this->shape_).total_size_;
  pvVar3 = (this->shape_).arena_or_elements_;
  iVar5 = (other->shape_).total_size_;
  pvVar4 = (other->shape_).arena_or_elements_;
  (this->shape_).current_size_ = (other->shape_).current_size_;
  (this->shape_).total_size_ = iVar5;
  (this->shape_).arena_or_elements_ = pvVar4;
  (other->shape_).current_size_ = iVar6;
  (other->shape_).total_size_ = iVar7;
  (other->shape_).arena_or_elements_ = pvVar3;
  pWVar2 = this->bias_;
  this->bias_ = other->bias_;
  other->bias_ = pWVar2;
  return;
}

Assistant:

void BiasLayerParams::InternalSwap(BiasLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  shape_.InternalSwap(&other->shape_);
  swap(bias_, other->bias_);
}